

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O3

bool __thiscall Assimp::DeboneProcess::ConsiderMesh(DeboneProcess *this,aiMesh *pMesh)

{
  float fVar1;
  uint uVar2;
  byte bVar3;
  void *pvVar4;
  ulong uVar5;
  Logger *this_00;
  uint uVar6;
  ulong uVar7;
  undefined4 uVar8;
  aiBone **ppaVar9;
  ulong uVar10;
  aiBone *paVar11;
  uint uVar12;
  aiFace *paVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertexBones;
  allocator_type local_89;
  DeboneProcess *local_88;
  float local_80;
  value_type_conflict2 local_7c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  ulong local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  if (pMesh->mNumBones == 0 || pMesh->mBones == (aiBone **)0x0) {
    return false;
  }
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  local_88 = this;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(ulong)pMesh->mNumBones,(bool *)&local_78,(allocator_type *)&local_7c);
  local_7c = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_78,(ulong)pMesh->mNumVertices,&local_7c,&local_89);
  uVar6 = pMesh->mNumBones;
  if (uVar6 != 0) {
    ppaVar9 = pMesh->mBones;
    uVar15 = 0;
    uVar14 = 0;
    do {
      uVar5 = uVar14;
      paVar11 = ppaVar9[uVar15];
      bVar3 = (byte)uVar15;
      if (paVar11->mNumWeights == 0) {
        uVar14 = 1L << (bVar3 & 0x3f);
      }
      else {
        uVar14 = 1L << (bVar3 & 0x3f);
        uVar10 = 0;
        local_60 = uVar5;
        do {
          fVar1 = paVar11->mWeights[uVar10].mWeight;
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            local_80 = fVar1;
            if (local_88->mThreshold <= fVar1) {
              uVar5 = (ulong)paVar11->mWeights[uVar10].mVertexId;
              uVar7 = (ulong)*(uint *)(CONCAT71(local_78.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                local_78.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                      uVar5 * 4);
              uVar8 = (int)uVar15;
              if ((uVar7 == 0xffffffff) || (uVar8 = 0xfffffffe, uVar15 != uVar7)) {
                *(undefined4 *)
                 (CONCAT71(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar5 * 4) = uVar8;
              }
              else {
                this_00 = DefaultLogger::get();
                Logger::warn(this_00,"Encountered double entry in bone weights");
              }
            }
            uVar5 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar15 >> 6];
            if ((uVar5 & uVar14) == 0) {
              uVar7 = uVar5 | uVar14;
              if (local_88->mThreshold <= local_80) {
                uVar7 = uVar5 & (-2L << (bVar3 & 0x3f) |
                                0xfffffffffffffffeU >> 0x40 - (bVar3 & 0x3f));
              }
              local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar15 >> 6] = uVar7;
            }
          }
          uVar10 = uVar10 + 1;
          ppaVar9 = pMesh->mBones;
          paVar11 = ppaVar9[uVar15];
        } while (uVar10 < paVar11->mNumWeights);
        uVar6 = pMesh->mNumBones;
        uVar5 = local_60;
      }
      bVar16 = (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[uVar15 >> 6] & uVar14) == 0;
      uVar15 = uVar15 + 1;
      uVar14 = CONCAT71((int7)(uVar5 >> 8),(byte)uVar5 | bVar16);
    } while (uVar15 < uVar6);
    if (((uVar5 & 1) != 0 || bVar16) && (uVar14 = (ulong)pMesh->mNumFaces, pMesh->mNumFaces != 0)) {
      paVar13 = pMesh->mFaces;
      uVar15 = 0;
      do {
        if (1 < paVar13[uVar15].mNumIndices) {
          uVar6 = *(uint *)(CONCAT71(local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                           (ulong)*paVar13[uVar15].mIndices * 4);
          uVar14 = 1;
          do {
            uVar2 = *(uint *)(CONCAT71(local_78.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       local_78.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                             (ulong)paVar13[uVar15].mIndices[uVar14] * 4);
            if (uVar6 != uVar2) {
              uVar12 = pMesh->mNumBones;
              if (uVar6 < uVar12) {
                local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[uVar6 >> 6] =
                     local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar6 >> 6] |
                     1L << ((byte)uVar6 & 0x3f);
                uVar12 = pMesh->mNumBones;
              }
              if (uVar2 < uVar12) {
                local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] =
                     local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] |
                     1L << ((byte)uVar2 & 0x3f);
              }
            }
            uVar14 = uVar14 + 1;
            paVar13 = pMesh->mFaces;
          } while (uVar14 < paVar13[uVar15].mNumIndices);
          uVar14 = (ulong)pMesh->mNumFaces;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < uVar14);
      uVar6 = pMesh->mNumBones;
    }
    uVar14 = 0;
    if (uVar6 != 0) {
      bVar16 = false;
      do {
        if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
          local_88->mNumBonesCanDoWithout = local_88->mNumBonesCanDoWithout + 1;
          bVar16 = true;
        }
        local_88->mNumBones = local_88->mNumBones + 1;
        uVar6 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar6;
      } while (uVar6 < pMesh->mNumBones);
      goto LAB_0036a117;
    }
  }
  bVar16 = false;
LAB_0036a117:
  pvVar4 = (void *)CONCAT71(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_,
                            local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_1_);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return bVar16;
}

Assistant:

bool DeboneProcess::ConsiderMesh(const aiMesh* pMesh)
{
    if(!pMesh->HasBones()) {
        return false;
    }

    bool split = false;

    //interstitial faces not permitted
    bool isInterstitialRequired = false;

    std::vector<bool> isBoneNecessary(pMesh->mNumBones,false);
    std::vector<unsigned int> vertexBones(pMesh->mNumVertices,UINT_MAX);

    const unsigned int cUnowned = UINT_MAX;
    const unsigned int cCoowned = UINT_MAX-1;

    for(unsigned int i=0;i<pMesh->mNumBones;i++)    {
        for(unsigned int j=0;j<pMesh->mBones[i]->mNumWeights;j++)   {
            float w = pMesh->mBones[i]->mWeights[j].mWeight;

            if(w==0.0f) {
                continue;
            }

            unsigned int vid = pMesh->mBones[i]->mWeights[j].mVertexId;
            if(w>=mThreshold)   {

                if(vertexBones[vid]!=cUnowned)  {
                    if(vertexBones[vid]==i) //double entry
                    {
                        ASSIMP_LOG_WARN("Encountered double entry in bone weights");
                    }
                    else //TODO: track attraction in order to break tie
                    {
                        vertexBones[vid] = cCoowned;
                    }
                }
                else vertexBones[vid] = i;
            }

            if(!isBoneNecessary[i]) {
                isBoneNecessary[i] = w<mThreshold;
            }
        }

        if(!isBoneNecessary[i])  {
            isInterstitialRequired = true;
        }
    }

    if(isInterstitialRequired) {
        for(unsigned int i=0;i<pMesh->mNumFaces;i++) {
            unsigned int v = vertexBones[pMesh->mFaces[i].mIndices[0]];

            for(unsigned int j=1;j<pMesh->mFaces[i].mNumIndices;j++) {
                unsigned int w = vertexBones[pMesh->mFaces[i].mIndices[j]];

                if(v!=w)    {
                    if(v<pMesh->mNumBones) isBoneNecessary[v] = true;
                    if(w<pMesh->mNumBones) isBoneNecessary[w] = true;
                }
            }
        }
    }

    for(unsigned int i=0;i<pMesh->mNumBones;i++)    {
        if(!isBoneNecessary[i]) {
            mNumBonesCanDoWithout++;
            split = true;
        }

        mNumBones++;
    }
    return split;
}